

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::fastcgi::on_read_stdin_eof_expected
          (fastcgi *this,error_code *e,io_handler *h,size_t s)

{
  bool bVar1;
  error_code *in_RSI;
  long in_RDI;
  error_code *in_stack_ffffffffffffffb0;
  unsigned_long in_stack_ffffffffffffffc0;
  error_code *in_stack_ffffffffffffffc8;
  callback<void_(const_std::error_code_&,_unsigned_long)> *in_stack_ffffffffffffffd0;
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else if (((*(char *)(in_RDI + 0x131) == '\x05') &&
           ((uint)*(ushort *)(in_RDI + 0x132) == *(uint *)(in_RDI + 0x16c))) &&
          (*(short *)(in_RDI + 0x134) == 0)) {
    std::error_code::error_code(in_stack_ffffffffffffffb0);
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else {
    std::error_code::error_code
              ((error_code *)&stack0xffffffffffffffd0,1,(error_category *)&cppcms_category);
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void on_read_stdin_eof_expected(booster::system::error_code const &e,io_handler const &h,size_t s)
		{
			if(e) { h(e,s); return; }
			if(	header_.type!=fcgi_stdin 
				|| header_.request_id!=request_id_ 
				|| header_.content_length!=0)
			{
				h(booster::system::error_code(errc::protocol_violation,cppcms_category),s);
				return;
			}
			h(booster::system::error_code(),s);
		}